

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void pica::assertionFailed(char *expr,char *file,long line)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long *in_stack_00000028;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char *__rhs;
  string local_158 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  std::operator+((char *)in_RDI,in_stack_fffffffffffffe90);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffffe90);
  __rhs = &stack0xfffffffffffffecf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_RDI,__rhs);
  toString<long>(in_stack_00000028);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_RDI,__rhs);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::operator<<((ostream *)&std::cerr,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void assertionFailed(const char* expr, const char* file, long line)
{
    std::string message = "ERROR: assertion \"" + std::string(expr) + "\" at " + std::string(file) + ":" +
        toString(line) + " failed";
    std::cerr << message;
}